

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O2

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
BlindMerge(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           *this,array<std::vector<int,_std::allocator<int>_>_*,_2UL> *arrs,ValueVector *write,
          iterator cur_run,size_t arr_index)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  vector<int,_std::allocator<int>_> *pvVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  _List_node_base *p_Var7;
  pointer piVar8;
  _List_node_base *p_Var9;
  pointer piVar10;
  int iVar11;
  _List_iterator<RunInfo> _Var12;
  long lVar13;
  int *piVar14;
  _List_node_base *p_Var15;
  long lVar16;
  _List_node_base *p_Var17;
  _List_node_base *p_Var18;
  
  _Var12 = std::next<std::_List_iterator<RunInfo>>(cur_run._M_node,1);
  p_Var3 = cur_run._M_node[1]._M_prev;
  p_Var4 = _Var12._M_node[1]._M_prev;
  pvVar5 = arrs->_M_elems[(long)cur_run._M_node[1]._M_next];
  pvVar6 = arrs->_M_elems[(long)_Var12._M_node[1]._M_next];
  p_Var7 = cur_run._M_node[2]._M_next;
  piVar8 = (write->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  p_Var9 = _Var12._M_node[2]._M_next;
  lVar13 = (long)p_Var3 * 4;
  p_Var15 = p_Var4;
  p_Var17 = p_Var3;
  p_Var18 = p_Var3;
  do {
    if (p_Var7 <= (_List_node_base *)((long)p_Var17 - (long)p_Var3)) {
      piVar14 = (int *)(lVar13 + (long)(write->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start);
      for (; (_List_node_base *)((long)p_Var15 - (long)p_Var4) < p_Var9;
          p_Var15 = (_List_node_base *)((long)&p_Var15->_M_next + 1)) {
        *piVar14 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[(long)p_Var15];
        piVar14 = piVar14 + 1;
      }
LAB_0010818f:
      cur_run._M_node[1]._M_next = (_List_node_base *)arr_index;
      return;
    }
    if (p_Var9 <= (_List_node_base *)((long)p_Var15 - (long)p_Var4)) {
      piVar8 = (write->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar16 = 0;
          (_List_node_base *)
          ((long)&((_List_node_base *)((long)p_Var17 - (long)p_Var3))->_M_next + lVar16) < p_Var7;
          lVar16 = lVar16 + 1) {
        *(int *)((long)piVar8 + lVar16 * 4 + lVar13) = piVar10[(long)&p_Var17->_M_next + lVar16];
      }
      goto LAB_0010818f;
    }
    iVar1 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[(long)p_Var17];
    iVar2 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[(long)p_Var15];
    iVar11 = iVar2;
    if (iVar1 < iVar2) {
      iVar11 = iVar1;
    }
    p_Var15 = (_List_node_base *)((long)&p_Var15->_M_next + (ulong)(iVar2 <= iVar1));
    p_Var17 = (_List_node_base *)((long)&p_Var17->_M_next + (ulong)(iVar1 < iVar2));
    piVar8[(long)p_Var18] = iVar11;
    p_Var18 = (_List_node_base *)((long)&p_Var18->_M_next + 1);
    lVar13 = lVar13 + 4;
  } while( true );
}

Assistant:

void BlindMerge(std::array<ValueVector *, 2> &arrs, ValueVector &write,
                    typename std::list<RunInfo>::iterator cur_run, size_t arr_index) {
        auto next_run = std::next(cur_run, 1);
        size_t one = cur_run->elem_index,
                two = next_run->elem_index,
                k = cur_run->elem_index;
        ValueVector &curr_arr = *arrs[cur_run->array_index];
        ValueVector &next_arr = *arrs[next_run->array_index];

        while ((one - cur_run->elem_index) < cur_run->run_size &&
               (two - next_run->elem_index) < next_run->run_size) {

            if (curr_arr[one] < next_arr[two]) {
                write[k] = curr_arr[one];
                one++;
            } else {
                write[k] = next_arr[two];
                two++;
            }
            k++;
        }
        // if both runs don't have the same size, copy the remaining elements over
        if ((one - cur_run->elem_index) < cur_run->run_size) {
            for (size_t i = (one - cur_run->elem_index); i < cur_run->run_size; i++) {
                write[k] = curr_arr[i + cur_run->elem_index];
                k++;
            }
        } else {
            for (size_t i = (two - next_run->elem_index); i < next_run->run_size; i++) {
                write[k] = next_arr[i + next_run->elem_index];
                k++;
            }
        }
        cur_run->array_index = arr_index;
    }